

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

xml_node * xml_parse_node(xml_parser *parser)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint8_t uVar3;
  _Bool _Var4;
  int iVar5;
  xml_node **nodes;
  xml_string *s;
  uint8_t *puVar6;
  char *pcVar7;
  size_t sVar8;
  char *__s;
  char *__s_00;
  xml_attribute *pxVar9;
  xml_string *pxVar10;
  size_t sVar11;
  xml_node *pxVar12;
  ushort **ppuVar13;
  xml_string *b;
  ulong uVar14;
  char **nextp;
  char **extraout_RDX;
  char **nextp_00;
  char **extraout_RDX_00;
  ulong uVar15;
  size_t sVar16;
  xml_node **__ptr;
  xml_attribute **local_60;
  int local_58;
  char local_50 [8];
  xml_node **local_48;
  size_t local_40;
  uint8_t *local_38;
  
  nodes = (xml_node **)calloc(1,8);
  xml_skip_whitespace(parser);
  uVar3 = xml_parser_peek(parser,0);
  if (uVar3 == '<') {
    uVar14 = parser->position + 1;
    parser->position = uVar14;
    if (parser->length <= uVar14) {
      parser->position = parser->length - 1;
    }
    s = xml_parse_tag_end(parser);
    if (s != (xml_string *)0x0) {
      local_40 = s->length;
      local_50[0] = '\0';
      local_50[1] = '\0';
      local_50[2] = '\0';
      local_50[3] = '\0';
      local_50[4] = '\0';
      local_50[5] = '\0';
      local_50[6] = '\0';
      local_50[7] = '\0';
      local_60 = (xml_attribute **)calloc(1,8);
      puVar6 = xml_string_clone(s);
      pcVar7 = xml_strtok_r((char *)puVar6,local_50,nextp);
      if (pcVar7 != (char *)0x0) {
        local_48 = nodes;
        sVar8 = strlen(pcVar7);
        s->length = sVar8;
        nextp_00 = extraout_RDX;
        while (pcVar7 = xml_strtok_r((char *)0x0,local_50,nextp_00), nodes = local_48,
              pcVar7 != (char *)0x0) {
          sVar8 = strlen(pcVar7);
          __s = (char *)malloc(sVar8 + 1);
          __s_00 = (char *)malloc(sVar8 + 1);
          iVar5 = __isoc99_sscanf(pcVar7,"%[^=]=\"%[^\"]",__s,__s_00);
          if ((iVar5 == 2) ||
             (iVar5 = __isoc99_sscanf(pcVar7,"%[^=]=\'%[^\']",__s,__s_00), iVar5 == 2)) {
            local_58 = (int)puVar6;
            puVar1 = s->buffer;
            sVar8 = strlen(__s);
            local_38 = puVar1 + ((int)pcVar7 - local_58) + sVar8 + 2;
            pxVar9 = (xml_attribute *)malloc(0x10);
            pxVar10 = (xml_string *)malloc(0x10);
            pxVar9->name = pxVar10;
            pxVar10->buffer = puVar1 + ((int)pcVar7 - local_58);
            pxVar10->length = sVar8;
            pxVar10 = (xml_string *)malloc(0x10);
            pxVar9->content = pxVar10;
            pxVar10->buffer = local_38;
            sVar8 = strlen(__s_00);
            pxVar10->length = sVar8;
            sVar11 = get_zero_terminated_array_attributes(local_60);
            local_60 = (xml_attribute **)realloc(local_60,sVar11 * 8 + 0x10);
            local_60[sVar11] = pxVar9;
            local_60[sVar11 + 1] = (xml_attribute *)0x0;
          }
          free(__s);
          free(__s_00);
          nextp_00 = extraout_RDX_00;
        }
      }
      free(puVar6);
      if ((s->length != 0) && (s->buffer[local_40 - 1] == '/')) {
        pxVar10 = (xml_string *)0x0;
        goto LAB_00102ea0;
      }
      uVar3 = xml_parser_peek(parser,0);
      if (uVar3 == '<') {
        pxVar10 = (xml_string *)0x0;
        while (uVar3 = xml_parser_peek(parser,1), uVar3 != '/') {
          pxVar12 = xml_parse_node(parser);
          if (pxVar12 == (xml_node *)0x0) {
            xml_parser_error(parser,NEXT_CHARACTER,"xml_parse_node::child");
            b = (xml_string *)0x0;
            pxVar10 = (xml_string *)0x0;
            goto LAB_001030d1;
          }
          sVar11 = get_zero_terminated_array_nodes(nodes);
          nodes = (xml_node **)realloc(nodes,sVar11 * 8 + 0x10);
          nodes[sVar11] = pxVar12;
          nodes[sVar11 + 1] = (xml_node *)0x0;
        }
LAB_00102fc9:
        xml_skip_whitespace(parser);
        uVar3 = xml_parser_peek(parser,0);
        if (uVar3 == '<') {
          uVar3 = xml_parser_peek(parser,1);
          if (uVar3 != '/') goto LAB_00103050;
          uVar14 = parser->position + 2;
          parser->position = uVar14;
          if (parser->length <= uVar14) {
            parser->position = parser->length - 1;
          }
          b = xml_parse_tag_end(parser);
          if (b != (xml_string *)0x0) {
            _Var4 = xml_string_equals(s,b);
            if (_Var4) {
              free(b);
LAB_00102ea0:
              pxVar12 = (xml_node *)malloc(0x20);
              pxVar12->name = s;
              pxVar12->content = pxVar10;
              pxVar12->attributes = local_60;
              pxVar12->children = nodes;
              return pxVar12;
            }
            xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag missmatch");
            goto LAB_001030d1;
          }
        }
        else {
          xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_tag_close::expected closing tag `<\'"
                          );
LAB_00103050:
          uVar3 = xml_parser_peek(parser,1);
          if (uVar3 != '/') {
            xml_parser_error(parser,NEXT_CHARACTER,"xml_parse_tag_close::expected closing tag `/\'")
            ;
          }
        }
        xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag_close");
        b = (xml_string *)0x0;
      }
      else {
        xml_skip_whitespace(parser);
        uVar14 = parser->position;
        uVar2 = parser->length;
        sVar11 = 0;
        uVar15 = uVar14;
        while ((uVar14 + sVar11 < uVar2 && (uVar3 = xml_parser_peek(parser,0), uVar3 != '<'))) {
          uVar15 = uVar15 + 1;
          if (uVar2 <= uVar15) {
            uVar15 = uVar2 - 1;
          }
          parser->position = uVar15;
          sVar11 = sVar11 + 1;
        }
        uVar3 = xml_parser_peek(parser,0);
        if (uVar3 == '<') {
          puVar6 = parser->buffer;
          do {
            sVar16 = sVar11;
            if (sVar16 == 0) break;
            ppuVar13 = __ctype_b_loc();
            sVar11 = sVar16 - 1;
          } while ((*(byte *)((long)*ppuVar13 + (ulong)(puVar6 + uVar14)[sVar16 - 1] * 2 + 1) & 0x20
                   ) != 0);
          pxVar10 = (xml_string *)malloc(0x10);
          pxVar10->buffer = puVar6 + uVar14;
          pxVar10->length = sVar16;
          goto LAB_00102fc9;
        }
        b = (xml_string *)0x0;
        xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_content::expected <");
        xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_node::content");
        pxVar10 = (xml_string *)0x0;
      }
LAB_001030d1:
      free(s);
      free(b);
      free(pxVar10);
      __ptr = nodes;
      goto LAB_001030ec;
    }
  }
  else {
    xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_tag_open::expected opening tag");
  }
  xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag_open");
  __ptr = nodes;
LAB_001030ec:
  for (; *nodes != (xml_node *)0x0; nodes = nodes + 1) {
    xml_node_free(*nodes);
  }
  free(__ptr);
  return (xml_node *)0x0;
}

Assistant:

static struct xml_node* xml_parse_node(struct xml_parser* parser) {
	xml_parser_info(parser, "node");

	/* Setup variables
	 */
	struct xml_string* tag_open = 0;
	struct xml_string* tag_close = 0;
	struct xml_string* content = 0;

	size_t original_length;
	struct xml_attribute** attributes;

	struct xml_node** children = calloc(1, sizeof(struct xml_node*));
	children[0] = 0;


	/* Parse open tag
	 */
	tag_open = xml_parse_tag_open(parser);
	if (!tag_open) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag_open");
		goto exit_failure;
	}

	original_length = tag_open->length;
	attributes = xml_find_attributes(parser, tag_open);

	/* If tag ends with `/' it's self closing, skip content lookup */
	if (tag_open->length > 0 && '/' == tag_open->buffer[original_length - 1]) {
		/* Drop `/'
		 */
		goto node_creation;
	}

	/* If the content does not start with '<', a text content is assumed
	 */
	if ('<' != xml_parser_peek(parser, CURRENT_CHARACTER)) {
		content = xml_parse_content(parser);

		if (!content) {
			xml_parser_error(parser, 0, "xml_parse_node::content");
			goto exit_failure;
		}


	/* Otherwise children are to be expected
	 */
	} else while ('/' != xml_parser_peek(parser, NEXT_CHARACTER)) {

		/* Parse child node
		 */
		struct xml_node* child = xml_parse_node(parser);
		if (!child) {
			xml_parser_error(parser, NEXT_CHARACTER, "xml_parse_node::child");
			goto exit_failure;
		}

		/* Grow child array :)
		 */
		size_t old_elements = get_zero_terminated_array_nodes(children);
		size_t new_elements = old_elements + 1;
		children = realloc(children, (new_elements + 1) * sizeof(struct xml_node*));

		/* Save child
		 */
		children[new_elements - 1] = child;
		children[new_elements] = 0;
	}


	/* Parse close tag
	 */
	tag_close = xml_parse_tag_close(parser);
	if (!tag_close) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag_close");
		goto exit_failure;
	}


	/* Close tag has to match open tag
	 */
	if (!xml_string_equals(tag_open, tag_close)) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag missmatch");
		goto exit_failure;
	}


	/* Return parsed node
	 */
	xml_string_free(tag_close);

node_creation:;
	struct xml_node* node = malloc(sizeof(struct xml_node));
	node->name = tag_open;
	node->content = content;
	node->attributes = attributes;
	node->children = children;
	return node;


	/* A failure occured, so free all allocalted resources
	 */
exit_failure:
	if (tag_open) {
		xml_string_free(tag_open);
	}
	if (tag_close) {
		xml_string_free(tag_close);
	}
	if (content) {
		xml_string_free(content);
	}

	struct xml_node** it = children;
	while (*it) {
		xml_node_free(*it);
		++it;
	}
	free(children);

	return 0;
}